

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

uint __thiscall wallet::CWallet::GetKeyPoolSize(CWallet *this)

{
  long lVar1;
  bool bVar2;
  reference ppSVar3;
  long in_FS_OFFSET;
  ScriptPubKeyMan *spk_man;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *__range1;
  uint count;
  iterator __end1;
  iterator __begin1;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  uint local_54;
  CWallet *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
             (AnnotatedMixin<std::recursive_mutex> *)0xae6f4a);
  local_54 = 0;
  GetActiveScriptPubKeyMans(in_stack_ffffffffffffffe8);
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::begin(in_stack_ffffffffffffff70);
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::end(in_stack_ffffffffffffff70);
  while( true ) {
    bVar2 = std::operator==((_Self *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                            (_Self *)in_stack_ffffffffffffff70);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppSVar3 = std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator*
                        ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    in_stack_ffffffffffffff7c = (*(*ppSVar3)->_vptr_ScriptPubKeyMan[0x12])();
    local_54 = in_stack_ffffffffffffff7c + local_54;
    std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator++
              ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~set((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
          *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_54;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int CWallet::GetKeyPoolSize() const
{
    AssertLockHeld(cs_wallet);

    unsigned int count = 0;
    for (auto spk_man : GetActiveScriptPubKeyMans()) {
        count += spk_man->GetKeyPoolSize();
    }
    return count;
}